

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

void duckdb::
     HistogramFinalizeFunction<duckdb::HistogramFunctor,short,duckdb::DefaultMapType<std::map<short,unsigned_long,std::less<short>,std::allocator<std::pair<short_const,unsigned_long>>>>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  long *plVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  _Rb_tree_node_base *p_Var7;
  idx_t iVar8;
  idx_t iVar9;
  idx_t i_1;
  ulong uVar10;
  long lVar11;
  long lVar12;
  UnifiedVectorFormat sdata;
  long *local_78;
  long local_70;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  FlatVector::VerifyFlatVector(result);
  uVar3 = duckdb::ListVector::GetListSize(result);
  lVar11 = 0;
  for (iVar8 = 0; count != iVar8; iVar8 = iVar8 + 1) {
    iVar9 = iVar8;
    if (*local_78 != 0) {
      iVar9 = (idx_t)*(uint *)(*local_78 + iVar8 * 4);
    }
    lVar5 = **(long **)(local_70 + iVar9 * 8);
    if (lVar5 != 0) {
      lVar11 = lVar11 + *(long *)(lVar5 + 0x28);
    }
  }
  duckdb::ListVector::Reserve(result,lVar11 + uVar3);
  lVar4 = duckdb::MapVector::GetKeys(result);
  lVar5 = duckdb::MapVector::GetValues(result);
  lVar11 = *(long *)(result + 0x20);
  lVar5 = *(long *)(lVar5 + 0x20);
  for (uVar10 = 0; uVar10 != count; uVar10 = uVar10 + 1) {
    uVar6 = uVar10;
    if (*local_78 != 0) {
      uVar6 = (ulong)*(uint *)(*local_78 + uVar10 * 4);
    }
    lVar2 = **(long **)(local_70 + uVar6 * 8);
    if (lVar2 == 0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),offset + uVar10);
    }
    else {
      lVar12 = (offset + uVar10) * 0x10;
      plVar1 = (long *)(lVar11 + lVar12);
      *(ulong *)(lVar11 + lVar12) = uVar3;
      lVar12 = *(long *)(lVar4 + 0x20);
      for (p_Var7 = *(_Rb_tree_node_base **)(lVar2 + 0x18);
          p_Var7 != (_Rb_tree_node_base *)(lVar2 + 8);
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        *(short *)(lVar12 + uVar3 * 2) = (short)p_Var7[1]._M_color;
        *(_Base_ptr *)(lVar5 + uVar3 * 8) = p_Var7[1]._M_parent;
        uVar3 = uVar3 + 1;
      }
      plVar1[1] = uVar3 - *plVar1;
    }
  }
  duckdb::ListVector::SetListSize(result,uVar3);
  duckdb::Vector::Verify((ulong)result);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  return;
}

Assistant:

static void HistogramFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                      idx_t offset) {
	using HIST_STATE = HistogramAggState<T, typename MAP_TYPE::MAP_TYPE>;

	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HIST_STATE *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			continue;
		}
		new_entries += state.hist->size();
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (auto &entry : *state.hist) {
			OP::template HistogramFinalize<T>(entry.first, keys, current_offset);
			count_entries[current_offset] = entry.second;
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}